

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# users.h
# Opt level: O3

void __thiscall wasm::DataFlow::Users::stopUsingValues(Users *this,Node *node)

{
  pointer ppNVar1;
  _Hashtable<wasm::DataFlow::Node_*,_wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>,_std::__detail::_Identity,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var2;
  pointer ppNVar3;
  Node *local_30;
  Node *node_local;
  
  ppNVar3 = (node->values).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppNVar1 = (node->values).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppNVar3 != ppNVar1) {
    local_30 = node;
    do {
      p_Var2 = &getUsers(this,*ppNVar3)->_M_h;
      std::
      _Hashtable<wasm::DataFlow::Node_*,_wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>,_std::__detail::_Identity,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase(p_Var2,&local_30);
      ppNVar3 = ppNVar3 + 1;
    } while (ppNVar3 != ppNVar1);
  }
  return;
}

Assistant:

void stopUsingValues(Node* node) {
    for (auto* value : node->values) {
      auto& users = getUsers(value);
      users.erase(node);
    }
  }